

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqResWithDeletion.cpp
# Opt level: O2

void __thiscall Shell::EqResWithDeletionExtra::output(EqResWithDeletionExtra *this,ostream *out)

{
  _Hash_node_base this_00;
  bool bVar1;
  ostream *poVar2;
  __node_base *p_Var3;
  string local_50;
  
  std::operator<<(out,"resolved=[");
  p_Var3 = &(this->resolved)._M_h._M_before_begin;
  bVar1 = true;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    this_00._M_nxt = p_Var3[1]._M_nxt;
    if (!bVar1) {
      std::operator<<(out,",");
    }
    poVar2 = std::operator<<(out,"(");
    Kernel::Literal::toString_abi_cxx11_(&local_50,(Literal *)this_00._M_nxt);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,")");
    std::__cxx11::string::~string((string *)&local_50);
    bVar1 = false;
  }
  std::operator<<(out,"]");
  return;
}

Assistant:

void EqResWithDeletionExtra::output(std::ostream &out) const {
  bool first = true;
  out << "resolved=[";
  for(Literal *l : resolved) {
    if(!first)
      out << ",";
    first = false;
    out << "(" << l->toString() << ")";
  }
  out << "]";

}